

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  pointer pRVar1;
  bool bVar2;
  Node *pNVar3;
  mapped_type *pmVar4;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_RDX;
  SceneGraphFlattener *in_RSI;
  MultiTransformNode *new_node_1;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  TransformNode *new_node;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  Ref<embree::SceneGraph::Node> *child;
  iterator __end3;
  iterator __begin3;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range3;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffa08;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffffa10;
  value_type *in_stack_fffffffffffffa18;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffffa20;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffa30;
  Transformations *in_stack_fffffffffffffa38;
  TransformNode *in_stack_fffffffffffffa40;
  key_type *in_stack_fffffffffffffa48;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffa50;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffa90;
  SceneGraphFlattener *in_stack_fffffffffffffa98;
  Ref<embree::SceneGraph::Node> *local_550;
  long *local_4c8;
  long *local_488;
  long *local_460;
  long *local_438;
  long *local_410;
  long *local_3e8;
  long *local_3c0;
  Ref<embree::SceneGraph::Node> *local_398;
  long *local_370;
  long *local_348;
  _Self local_330;
  _Self local_328;
  long *local_320;
  long *local_318;
  long *local_310;
  long *local_308;
  long *local_300;
  long *local_2f8;
  reference local_2f0;
  Ref<embree::SceneGraph::Node> *local_2e8;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_2e0;
  Ref<embree::SceneGraph::Node> *local_2d8;
  
  pRVar1 = (in_RDX->
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pRVar1 == (pointer)0x0) {
    local_398 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_398 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,&SceneGraph::GroupNode::typeinfo,0
                              );
  }
  if (local_398 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_398->ptr->fileName)();
  }
  if (local_398 == (Ref<embree::SceneGraph::Node> *)0x0) {
    pRVar1 = (in_RDX->
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pRVar1 == (pointer)0x0) {
      local_3c0 = (long *)0x0;
    }
    else {
      local_3c0 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::TriangleMeshNode::typeinfo,0);
    }
    local_2f8 = local_3c0;
    if (local_3c0 != (long *)0x0) {
      (**(code **)(*local_3c0 + 0x10))();
    }
    if (local_2f8 == (long *)0x0) {
      pRVar1 = (in_RDX->
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pRVar1 == (pointer)0x0) {
        local_3e8 = (long *)0x0;
      }
      else {
        local_3e8 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::QuadMeshNode::typeinfo,0);
      }
      local_300 = local_3e8;
      if (local_3e8 != (long *)0x0) {
        (**(code **)(*local_3e8 + 0x10))();
      }
      if (local_300 == (long *)0x0) {
        pRVar1 = (in_RDX->
                 super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pRVar1 == (pointer)0x0) {
          local_410 = (long *)0x0;
        }
        else {
          local_410 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::GridMeshNode::typeinfo,0);
        }
        local_308 = local_410;
        if (local_410 != (long *)0x0) {
          (**(code **)(*local_410 + 0x10))();
        }
        if (local_308 == (long *)0x0) {
          pRVar1 = (in_RDX->
                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (pRVar1 == (pointer)0x0) {
            local_438 = (long *)0x0;
          }
          else {
            local_438 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                               &SceneGraph::SubdivMeshNode::typeinfo,0);
          }
          local_310 = local_438;
          if (local_438 != (long *)0x0) {
            (**(code **)(*local_438 + 0x10))();
          }
          if (local_310 == (long *)0x0) {
            pRVar1 = (in_RDX->
                     super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (pRVar1 == (pointer)0x0) {
              local_460 = (long *)0x0;
            }
            else {
              local_460 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                                 &SceneGraph::HairSetNode::typeinfo,0);
            }
            local_318 = local_460;
            if (local_460 != (long *)0x0) {
              (**(code **)(*local_460 + 0x10))();
            }
            if (local_318 == (long *)0x0) {
              pRVar1 = (in_RDX->
                       super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (pRVar1 == (pointer)0x0) {
                local_488 = (long *)0x0;
              }
              else {
                local_488 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                                   &SceneGraph::PointSetNode::typeinfo,0);
              }
              local_320 = local_488;
              if (local_488 != (long *)0x0) {
                (**(code **)(*local_488 + 0x10))();
              }
              if (local_320 == (long *)0x0) {
                local_328._M_node =
                     (_Base_ptr)
                     std::
                     map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::find(in_stack_fffffffffffffa08,(key_type *)0x24df65);
                local_330._M_node =
                     (_Base_ptr)
                     std::
                     map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::end(in_stack_fffffffffffffa08);
                bVar2 = std::operator!=(&local_328,&local_330);
                if (bVar2) {
                  std::
                  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                  ::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                  std::
                  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
                }
                else {
                  pRVar1 = (in_RDX->
                           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (pRVar1 == (pointer)0x0) {
                    local_4c8 = (long *)0x0;
                  }
                  else {
                    local_4c8 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                                       &SceneGraph::TransformNode::typeinfo,0);
                  }
                  if (local_4c8 == (long *)0x0) {
                    pRVar1 = (in_RDX->
                             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if (pRVar1 == (pointer)0x0) {
                      local_550 = (Ref<embree::SceneGraph::Node> *)0x0;
                    }
                    else {
                      local_550 = (Ref<embree::SceneGraph::Node> *)
                                  __dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                                 &SceneGraph::MultiTransformNode::typeinfo,0);
                    }
                    if (local_550 != (Ref<embree::SceneGraph::Node> *)0x0) {
                      (**(code **)&local_550->ptr->fileName)();
                      pNVar3 = (Node *)SceneGraph::MultiTransformNode::operator_new(0x24e5b8);
                      convertMultiLevelInstances((SceneGraphFlattener *)pNVar3,local_550);
                      SceneGraph::MultiTransformNode::MultiTransformNode
                                ((MultiTransformNode *)in_stack_fffffffffffffa40,
                                 (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                  *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
                      if (local_370 != (long *)0x0) {
                        (**(code **)(*local_370 + 0x18))();
                      }
                      pmVar4 = std::
                               map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               ::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                      if (pNVar3 != (Node *)0x0) {
                        (**(code **)&((Node *)(pNVar3->super_RefCount)._vptr_RefCount)->fileName)();
                      }
                      if (pmVar4->ptr != (Node *)0x0) {
                        (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
                      }
                      pmVar4->ptr = pNVar3;
                      if (pNVar3 != (Node *)0x0) {
                        (**(code **)&((Node *)(pNVar3->super_RefCount)._vptr_RefCount)->fileName)();
                      }
                      std::
                      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                      ::push_back(in_stack_fffffffffffffa10,(value_type *)in_stack_fffffffffffffa08)
                      ;
                      if (pNVar3 != (Node *)0x0) {
                        (*(code *)(((Node *)(pNVar3->super_RefCount)._vptr_RefCount)->fileName).
                                  _M_string_length)();
                      }
                    }
                    if (local_550 != (Ref<embree::SceneGraph::Node> *)0x0) {
                      (*(code *)(local_550->ptr->fileName)._M_string_length)();
                    }
                  }
                  else {
                    (**(code **)(*local_4c8 + 0x10))();
                    pNVar3 = (Node *)SceneGraph::TransformNode::operator_new(0x24e10d);
                    convertMultiLevelInstances(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
                    SceneGraph::TransformNode::TransformNode
                              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                               in_stack_fffffffffffffa30);
                    if (local_348 != (long *)0x0) {
                      (**(code **)(*local_348 + 0x18))();
                    }
                    pmVar4 = std::
                             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             ::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                    if (pNVar3 != (Node *)0x0) {
                      (*(pNVar3->super_RefCount)._vptr_RefCount[2])();
                    }
                    if (pmVar4->ptr != (Node *)0x0) {
                      (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
                    }
                    pmVar4->ptr = pNVar3;
                    if (pNVar3 != (Node *)0x0) {
                      (*(pNVar3->super_RefCount)._vptr_RefCount[2])();
                    }
                    std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::push_back(in_stack_fffffffffffffa10,(value_type *)in_stack_fffffffffffffa08);
                    if (pNVar3 != (Node *)0x0) {
                      (*(pNVar3->super_RefCount)._vptr_RefCount[3])();
                    }
                  }
                  if (local_4c8 != (long *)0x0) {
                    (**(code **)(*local_4c8 + 0x18))();
                  }
                }
              }
              else {
                (**(code **)(*local_320 + 0x18))();
                std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
              }
            }
            else {
              (**(code **)(*local_318 + 0x18))();
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
            }
          }
          else {
            (**(code **)(*local_310 + 0x18))();
            std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
          }
        }
        else {
          (**(code **)(*local_308 + 0x18))();
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
        }
      }
      else {
        (**(code **)(*local_300 + 0x18))();
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      }
    }
    else {
      (**(code **)(*local_2f8 + 0x18))();
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::push_back(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    }
  }
  else {
    local_2d8 = local_398 + 0xd;
    local_2e0._M_current =
         (Ref<embree::SceneGraph::Node> *)
         std::
         vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
         ::begin((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  *)in_stack_fffffffffffffa08);
    local_2e8 = (Ref<embree::SceneGraph::Node> *)
                std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::end((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                       *)in_stack_fffffffffffffa08);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)in_stack_fffffffffffffa10,
                              (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)in_stack_fffffffffffffa08), bVar2) {
      local_2f0 = __gnu_cxx::
                  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                  ::operator*(&local_2e0);
      convertMultiLevelInstances(in_RSI,in_RDX,local_398);
      __gnu_cxx::
      __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
      ::operator++(&local_2e0);
    }
  }
  if (local_398 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_398->ptr->fileName)._M_string_length)();
  }
  return;
}

Assistant:

void convertMultiLevelInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node)
    {
      if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertMultiLevelInstances(group,child);
      }
      else if (node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(node);
      }
      else if (object_mapping.find(node) != object_mapping.end()) {
        group.push_back(object_mapping[node]);
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>())
      {
        auto new_node = new SceneGraph::TransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>())
      {
        auto new_node = new SceneGraph::MultiTransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
    }